

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AttributeInfo *attributeInfo)

{
  char *__s;
  ostream *poVar1;
  string local_200;
  string local_1e0;
  allocator<char> local_1bd [13];
  string local_1b0 [8];
  string formatName;
  ostringstream caseName;
  AttributeInfo *attributeInfo_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(formatName.field_2._M_local_buf + 8))
  ;
  __s = ::vk::getFormatName(*(VkFormat *)(this + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,__s,local_1bd);
  std::allocator<char>::~allocator(local_1bd);
  poVar1 = std::operator<<((ostream *)(formatName.field_2._M_local_buf + 8),
                           *(char **)(VertexInputTest::s_glslTypeDescriptions +
                                     (ulong)*(uint *)this * 0x18));
  poVar1 = std::operator<<(poVar1,"_as_");
  std::__cxx11::string::substr((ulong)&local_200,(ulong)local_1b0);
  de::toLower(&local_1e0,&local_200);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  std::operator<<(poVar1,"_rate_");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  if (*(int *)(this + 8) == 0) {
    std::operator<<((ostream *)(formatName.field_2._M_local_buf + 8),"vertex");
  }
  else {
    std::operator<<((ostream *)(formatName.field_2._M_local_buf + 8),"instance");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(formatName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string getAttributeInfoCaseName (const VertexInputTest::AttributeInfo& attributeInfo)
{
	std::ostringstream	caseName;
	const std::string	formatName	= getFormatName(attributeInfo.vkType);

	caseName << VertexInputTest::s_glslTypeDescriptions[attributeInfo.glslType].name << "_as_" << de::toLower(formatName.substr(10)) << "_rate_";

	if (attributeInfo.inputRate == VK_VERTEX_INPUT_RATE_VERTEX)
		caseName <<  "vertex";
	else
		caseName <<  "instance";

	return caseName.str();
}